

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O1

BasicBlock * __thiscall spvtools::opt::Loop::FindConditionBlock(Loop *this)

{
  BasicBlockListTy *this_00;
  IRContext *pIVar1;
  CFG *this_01;
  Instruction *pIVar2;
  pointer puVar3;
  mapped_type pBVar4;
  Instruction *this_02;
  Loop *pLVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  size_type sVar9;
  mapped_type *ppBVar10;
  uint uVar11;
  pointer puVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  uint local_44;
  Loop *local_40;
  uint local_34;
  
  if (this->loop_merge_ != (BasicBlock *)0x0) {
    pIVar1 = this->context_;
    if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(pIVar1);
    }
    this_01 = (pIVar1->cfg_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
              _M_t.
              super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
              .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
    pIVar2 = (this->loop_merge_->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar6 = 0;
    local_40 = this;
    if (pIVar2->has_result_id_ == true) {
      uVar6 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
    }
    pvVar8 = CFG::preds(this_01,uVar6);
    puVar12 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar14 = puVar12 != puVar3;
    local_34 = 0;
    if (bVar14) {
      this_00 = &local_40->loop_basic_blocks_;
      uVar11 = *puVar12;
      local_44 = uVar11;
      sVar9 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&this_00->_M_h,&local_44);
      uVar13 = 0;
      if (sVar9 != 0) {
        uVar13 = uVar11;
      }
      puVar12 = puVar12 + 1;
      do {
        bVar14 = puVar12 != puVar3;
        local_34 = uVar13;
        if (puVar12 == puVar3) break;
        uVar11 = *puVar12;
        local_44 = uVar11;
        sVar9 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&this_00->_M_h,&local_44);
        local_34 = uVar11;
        if (uVar13 != 0) {
          local_34 = uVar13;
        }
        puVar12 = puVar12 + 1;
      } while ((sVar9 == 0) || (bVar15 = uVar13 == 0, uVar13 = local_34, bVar15));
    }
    pLVar5 = local_40;
    if (bVar14) {
      return (mapped_type)0x0;
    }
    if (local_34 == 0) {
      return (mapped_type)0x0;
    }
    pIVar1 = local_40->context_;
    if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(pIVar1);
    }
    ppBVar10 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&((pIVar1->cfg_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                         .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->
                        id2block_,&local_34);
    pBVar4 = *ppBVar10;
    if (pBVar4 != (mapped_type)0x0) {
      pIVar2 = (pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      if ((pIVar2 == (Instruction *)0x0) ||
         ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
        __assert_fail("!insts_.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                      ,0x7e,"const_iterator spvtools::opt::BasicBlock::ctail() const");
      }
      pIVar2 = (pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
      uVar6 = 0;
      if (pIVar2->opcode_ == OpBranchConditional) {
        uVar11 = (pIVar2->has_result_id_ & 1) + 1;
        if (pIVar2->has_type_id_ == false) {
          uVar11 = (uint)pIVar2->has_result_id_;
        }
        uVar7 = Instruction::GetSingleWordOperand(pIVar2,uVar11 + 1);
        this_02 = (pLVar5->loop_merge_->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        if (this_02->has_result_id_ == true) {
          uVar6 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
        }
        if (uVar7 == uVar6) {
          return pBVar4;
        }
        uVar11 = (pIVar2->has_result_id_ & 1) + 1;
        if (pIVar2->has_type_id_ == false) {
          uVar11 = (uint)pIVar2->has_result_id_;
        }
        uVar6 = Instruction::GetSingleWordOperand(pIVar2,uVar11 + 2);
        pIVar2 = (pLVar5->loop_merge_->label_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar7 = 0;
        if (pIVar2->has_result_id_ == true) {
          uVar7 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
        }
        if (uVar6 == uVar7) {
          return pBVar4;
        }
      }
    }
  }
  return (mapped_type)0x0;
}

Assistant:

BasicBlock* Loop::FindConditionBlock() const {
  if (!loop_merge_) {
    return nullptr;
  }
  BasicBlock* condition_block = nullptr;

  uint32_t in_loop_pred = 0;
  for (uint32_t p : context_->cfg()->preds(loop_merge_->id())) {
    if (IsInsideLoop(p)) {
      if (in_loop_pred) {
        // 2 in-loop predecessors.
        return nullptr;
      }
      in_loop_pred = p;
    }
  }
  if (!in_loop_pred) {
    // Merge block is unreachable.
    return nullptr;
  }

  BasicBlock* bb = context_->cfg()->block(in_loop_pred);

  if (!bb) return nullptr;

  const Instruction& branch = *bb->ctail();

  // Make sure the branch is a conditional branch.
  if (branch.opcode() != spv::Op::OpBranchConditional) return nullptr;

  // Make sure one of the two possible branches is to the merge block.
  if (branch.GetSingleWordInOperand(1) == loop_merge_->id() ||
      branch.GetSingleWordInOperand(2) == loop_merge_->id()) {
    condition_block = bb;
  }

  return condition_block;
}